

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O2

assetsys_error_t
assetsys_mount(assetsys_t *sys,char *path,char *zip_mem,size_t zip_mem_size,char *mount_as)

{
  strpool_t *psVar1;
  mz_zip_archive *pZip;
  uint uVar2;
  assetsys_internal_mount_t *paVar3;
  bool bVar4;
  int iVar5;
  mz_bool mVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  assetsys_internal_mount_t *__dest;
  unsigned_long_long uVar10;
  assetsys_internal_file_t *paVar11;
  assetsys_internal_folder_t *paVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  mz_uint mVar16;
  assetsys_internal_collated_t *paVar17;
  int i;
  long lVar18;
  mz_uint mVar19;
  assetsys_internal_mount_type_t local_450;
  stat s;
  
  if (mount_as == (char *)0x0 || path == (char *)0x0) {
    return ASSETSYS_ERROR_INVALID_PARAMETER;
  }
  pcVar8 = strchr(path,0x5c);
  if (pcVar8 != (char *)0x0) {
    return ASSETSYS_ERROR_INVALID_PATH;
  }
  pcVar8 = strchr(mount_as,0x3a);
  if (pcVar8 != (char *)0x0) {
    return ASSETSYS_ERROR_INVALID_PATH;
  }
  pcVar8 = strchr(mount_as,0x5c);
  if (pcVar8 != (char *)0x0) {
    return ASSETSYS_ERROR_INVALID_PATH;
  }
  sVar9 = strlen(path);
  iVar5 = (int)sVar9;
  if (0 < iVar5) {
    if (*path == '/') {
      return ASSETSYS_ERROR_INVALID_PATH;
    }
    if ((iVar5 != 1) && (path[iVar5 - 1] == '/')) {
      return ASSETSYS_ERROR_INVALID_PATH;
    }
  }
  sVar9 = strlen(mount_as);
  iVar5 = (int)sVar9;
  if (iVar5 == 0) {
    return ASSETSYS_ERROR_INVALID_PATH;
  }
  if (*mount_as != '/') {
    return ASSETSYS_ERROR_INVALID_PATH;
  }
  if ((1 < iVar5) && (mount_as[iVar5 - 1] == '/')) {
    return ASSETSYS_ERROR_INVALID_PATH;
  }
  local_450 = ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP;
  if (zip_mem == (char *)0x0) {
    pcVar8 = ".";
    if (*path != '\0') {
      pcVar8 = path;
    }
    iVar5 = stat(pcVar8,(stat *)&s);
    if (iVar5 != 0) {
      return ASSETSYS_ERROR_INVALID_PATH;
    }
    if ((s.st_mode >> 0xe & 1) != 0) {
      local_450 = ASSETSYS_INTERNAL_MOUNT_TYPE_DIR;
      bVar4 = true;
      goto LAB_0014859f;
    }
    if (-1 < (short)s.st_mode) {
      return ASSETSYS_ERROR_INVALID_PATH;
    }
  }
  bVar4 = false;
LAB_0014859f:
  iVar5 = sys->mounts_count;
  iVar7 = sys->mounts_capacity;
  if (iVar5 < iVar7) {
    __dest = sys->mounts;
  }
  else {
    sys->mounts_capacity = iVar7 * 2;
    __dest = (assetsys_internal_mount_t *)malloc((long)iVar7 * 0x130);
    paVar3 = sys->mounts;
    memcpy(__dest,paVar3,(long)iVar5 * 0x98);
    free(paVar3);
    sys->mounts = __dest;
    iVar5 = sys->mounts_count;
  }
  paVar3 = __dest + iVar5;
  uVar10 = assetsys_internal_add_string(sys,mount_as);
  __dest[iVar5].mounted_as = uVar10;
  sVar9 = strlen(mount_as);
  __dest[iVar5].mount_len = (int)sVar9;
  uVar10 = assetsys_internal_add_string(sys,path);
  __dest[iVar5].path = uVar10;
  __dest[iVar5].type = local_450;
  __dest[iVar5].files_count = 0;
  __dest[iVar5].files_capacity = 0x1000;
  paVar11 = (assetsys_internal_file_t *)malloc(0xc000);
  __dest[iVar5].files = paVar11;
  __dest[iVar5].dirs_capacity = 0x400;
  paVar12 = (assetsys_internal_folder_t *)malloc(0x1000);
  __dest[iVar5].dirs = paVar12;
  __dest[iVar5].dirs_count = 1;
  iVar5 = assetsys_internal_register_collated(sys,mount_as,0);
  paVar12->collated_index = iVar5;
  if (bVar4) {
    assetsys_internal_recurse_directories(sys,iVar5,paVar3);
  }
  else {
    pZip = &paVar3->zip;
    (paVar3->zip).m_pAlloc = (mz_alloc_func)0x0;
    (paVar3->zip).m_pFree = (mz_free_func)0x0;
    (paVar3->zip).m_pRealloc = (mz_realloc_func)0x0;
    (paVar3->zip).m_pAlloc_opaque = (void *)0x0;
    (paVar3->zip).m_pIO_opaque = (void *)0x0;
    (paVar3->zip).m_pState = (mz_zip_internal_state *)0x0;
    (paVar3->zip).m_pRead = (mz_file_read_func)0x0;
    (paVar3->zip).m_pWrite = (mz_file_write_func)0x0;
    (paVar3->zip).m_total_files = 0;
    (paVar3->zip).m_zip_mode = MZ_ZIP_MODE_INVALID;
    *(undefined8 *)&(paVar3->zip).m_file_offset_alignment = 0;
    (paVar3->zip).m_archive_size = 0;
    (paVar3->zip).m_central_directory_file_ofs = 0;
    (paVar3->zip).m_pAlloc = assetsys_internal_mz_alloc;
    (paVar3->zip).m_pRealloc = assetsys_internal_mz_realloc;
    (paVar3->zip).m_pFree = assetsys_internal_mz_free;
    (paVar3->zip).m_pAlloc_opaque = sys->memctx;
    mVar16 = 0;
    mVar6 = mz_zip_reader_init_mem(pZip,zip_mem,zip_mem_size,0);
    if (mVar6 == 0) {
LAB_00148c19:
      free(paVar3->dirs);
      free(paVar3->files);
      return ASSETSYS_ERROR_FAILED_TO_READ_ZIP;
    }
    mVar19 = (paVar3->zip).m_total_files;
    pcVar8 = sys->temp;
    psVar1 = &sys->strpool;
    if ((int)mVar19 < 1) {
      mVar19 = 0;
    }
    for (; mVar19 != mVar16; mVar16 = mVar16 + 1) {
      mVar6 = mz_zip_reader_is_file_a_directory(pZip,mVar16);
      if (mVar6 != 0) {
        iVar5 = paVar3->dirs_count;
        iVar7 = paVar3->dirs_capacity;
        if (iVar7 <= iVar5) {
          paVar3->dirs_capacity = iVar7 * 2;
          paVar12 = (assetsys_internal_folder_t *)malloc((long)iVar7 << 3);
          memcpy(paVar12,paVar3->dirs,(long)iVar5 << 2);
          free(paVar3->dirs);
          paVar3->dirs = paVar12;
        }
        mz_zip_reader_get_filename(pZip,mVar16,(char *)&s,0x400);
        paVar12 = paVar3->dirs;
        iVar5 = paVar3->dirs_count;
        paVar3->dirs_count = iVar5 + 1;
        pcVar13 = strpool_cstr(psVar1,paVar3->mounted_as);
        strcpy(pcVar8,pcVar13);
        sVar9 = strlen(pcVar8);
        (sys->temp + sVar9)[0] = '/';
        (sys->temp + sVar9)[1] = '\0';
        strcat(pcVar8,(char *)&s);
        sVar9 = strlen(pcVar8);
        sys->temp[sVar9 - 1] = '\0';
        iVar7 = assetsys_internal_register_collated(sys,pcVar8,0);
        paVar12[iVar5].collated_index = iVar7;
      }
    }
    for (mVar16 = 0; mVar16 != mVar19; mVar16 = mVar16 + 1) {
      mVar6 = mz_zip_reader_is_file_a_directory(pZip,mVar16);
      if (mVar6 == 0) {
        iVar5 = paVar3->files_count;
        iVar7 = paVar3->files_capacity;
        if (iVar7 <= iVar5) {
          paVar3->files_capacity = iVar7 * 2;
          paVar11 = (assetsys_internal_file_t *)malloc((long)iVar7 * 0x18);
          memcpy(paVar11,paVar3->files,(long)iVar5 * 0xc);
          free(paVar3->files);
          paVar3->files = paVar11;
        }
        mVar6 = mz_zip_reader_file_stat(pZip,mVar16,(mz_zip_archive_file_stat *)&s);
        if (mVar6 == 0) {
          mz_zip_reader_end(pZip);
          goto LAB_00148c19;
        }
        paVar11 = paVar3->files;
        iVar5 = paVar3->files_count;
        paVar3->files_count = iVar5 + 1;
        pcVar13 = strpool_cstr(psVar1,paVar3->mounted_as);
        strcpy(pcVar8,pcVar13);
        sVar9 = strlen(pcVar8);
        (sys->temp + sVar9)[0] = '/';
        (sys->temp + sVar9)[1] = '\0';
        strcat(pcVar8,(char *)((long)&s.st_blocks + 4));
        iVar7 = assetsys_internal_register_collated(sys,pcVar8,1);
        paVar11[iVar5].collated_index = iVar7;
        paVar11[iVar5].size = (int)s.st_rdev;
        paVar11[iVar5].zip_index = mVar16;
        assetsys_internal_dirname(pcVar8);
        sVar9 = strlen(assetsys_internal_dirname::result);
        uVar10 = strpool_inject(psVar1,assetsys_internal_dirname::result,(int)sVar9 + -1);
        uVar2 = paVar3->dirs_count;
        uVar15 = 0;
        uVar14 = 0;
        if (0 < (int)uVar2) {
          uVar14 = (ulong)uVar2;
        }
        bVar4 = false;
        for (; uVar14 != uVar15; uVar15 = uVar15 + 1) {
          if (uVar10 == sys->collated[paVar3->dirs[uVar15].collated_index].path) {
            bVar4 = true;
          }
        }
        if (!bVar4) {
          paVar12 = paVar3->dirs;
          paVar3->dirs_count = uVar2 + 1;
          pcVar13 = strpool_cstr(psVar1,uVar10);
          iVar5 = assetsys_internal_register_collated(sys,pcVar13,0);
          paVar12[(int)uVar2].collated_index = iVar5;
        }
      }
    }
  }
  psVar1 = &sys->strpool;
  for (lVar18 = 0; lVar18 < paVar3->dirs_count; lVar18 = lVar18 + 1) {
    iVar5 = paVar3->dirs[lVar18].collated_index;
    if (sys->collated[iVar5].parent < 0) {
      paVar17 = sys->collated + iVar5;
      pcVar8 = strpool_cstr(psVar1,paVar17->path);
      assetsys_internal_dirname(pcVar8);
      sVar9 = strlen(assetsys_internal_dirname::result);
      uVar10 = strpool_inject(psVar1,assetsys_internal_dirname::result,(int)sVar9 + -1);
      uVar14 = 0;
      uVar15 = (ulong)(uint)sys->collated_count;
      if (sys->collated_count < 1) {
        uVar15 = uVar14;
      }
      iVar5 = 0;
      for (; uVar15 * 0x18 - uVar14 != 0; uVar14 = uVar14 + 0x18) {
        if (*(unsigned_long_long *)((long)&sys->collated->path + uVar14) == uVar10) {
          paVar17->parent = iVar5;
          goto LAB_001487e2;
        }
        iVar5 = iVar5 + 1;
      }
      if (paVar17->parent < 0) {
        strpool_discard(psVar1,uVar10);
      }
    }
LAB_001487e2:
  }
  lVar18 = 0;
  do {
    if (paVar3->files_count <= lVar18) {
      sys->mounts_count = sys->mounts_count + 1;
      return ASSETSYS_SUCCESS;
    }
    iVar5 = paVar3->files[lVar18].collated_index;
    if (sys->collated[iVar5].parent < 0) {
      paVar17 = sys->collated + iVar5;
      pcVar8 = strpool_cstr(psVar1,paVar17->path);
      assetsys_internal_dirname(pcVar8);
      sVar9 = strlen(assetsys_internal_dirname::result);
      uVar10 = strpool_inject(psVar1,assetsys_internal_dirname::result,(int)sVar9 + -1);
      uVar14 = 0;
      uVar15 = (ulong)(uint)sys->collated_count;
      if (sys->collated_count < 1) {
        uVar15 = uVar14;
      }
      iVar5 = 0;
      for (; uVar15 * 0x18 - uVar14 != 0; uVar14 = uVar14 + 0x18) {
        if (*(unsigned_long_long *)((long)&sys->collated->path + uVar14) == uVar10) {
          paVar17->parent = iVar5;
          goto LAB_00148893;
        }
        iVar5 = iVar5 + 1;
      }
      if (paVar17->parent < 0) {
        strpool_discard(psVar1,uVar10);
      }
    }
LAB_00148893:
    lVar18 = lVar18 + 1;
  } while( true );
}

Assistant:

assetsys_error_t assetsys_mount( assetsys_t* sys, char const* path, const char *zip_mem, size_t zip_mem_size, char const* mount_as )
    {
    if( !path ) return ASSETSYS_ERROR_INVALID_PARAMETER;
    if( !mount_as ) return ASSETSYS_ERROR_INVALID_PARAMETER;
    if( strchr( path, '\\' ) ) return ASSETSYS_ERROR_INVALID_PATH;
    if( strchr( mount_as, ':' ) ) return ASSETSYS_ERROR_INVALID_PATH;
    if( strchr( mount_as, '\\' ) ) return ASSETSYS_ERROR_INVALID_PATH;
    int len = (int) strlen( path );
    if( len > 0 && path[ 0 ] == '/' ) return ASSETSYS_ERROR_INVALID_PATH;       
    if( len > 1 && path[ len - 1 ] == '/' ) return ASSETSYS_ERROR_INVALID_PATH;     
    int mount_len = (int) strlen( mount_as );
    if( mount_len == 0 || mount_as[ 0 ] != '/' || ( mount_len > 1 && mount_as[ mount_len - 1 ] == '/' ) ) 
        return ASSETSYS_ERROR_INVALID_PATH;     
    
    enum assetsys_internal_mount_type_t type;

    if (!zip_mem) 
    {
    #if defined( _MSC_VER ) && _MSC_VER >= 1400
        struct _stat64 s;
        int res = __stat64( *path == '\0' ? "." : path, &s );
    #else
        struct stat s;
        int res = stat( *path == '\0' ? "." : path, &s );
    #endif
    if( res == 0 )
        {
        if( s.st_mode & S_IFDIR ) type = ASSETSYS_INTERNAL_MOUNT_TYPE_DIR;
        else if( s.st_mode & S_IFREG ) type = ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP;
        else return ASSETSYS_ERROR_INVALID_PATH;
        }
    else
        {
        return ASSETSYS_ERROR_INVALID_PATH;
        }
    }
    else 
    {
        type = ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP;
    }

    if( sys->mounts_count >= sys->mounts_capacity )
        {
        sys->mounts_capacity *= 2;
        struct assetsys_internal_mount_t* new_mounts = (struct assetsys_internal_mount_t*) ASSETSYS_MALLOC( sys->memctx, 
            sizeof( *sys->mounts ) * sys->mounts_capacity );
        memcpy( new_mounts, sys->mounts, sizeof( *sys->mounts ) * sys->mounts_count );
        ASSETSYS_FREE( sys->memctx, sys->mounts );
        sys->mounts = new_mounts;
        }

    struct assetsys_internal_mount_t* mount = &sys->mounts[ sys->mounts_count ];

    mount->mounted_as = assetsys_internal_add_string( sys, mount_as ? mount_as : "" );
    mount->mount_len = mount_as ? (int) strlen( mount_as ) : 0;
    mount->path = assetsys_internal_add_string( sys, path );
    mount->type = type;
        
    mount->files_count = 0;
    mount->files_capacity = 4096;
    mount->files = (struct assetsys_internal_file_t*) ASSETSYS_MALLOC( sys->memctx, 
        sizeof( *(mount->files) ) * mount->files_capacity );

    mount->dirs_count = 0;
    mount->dirs_capacity = 1024;
    mount->dirs = (struct assetsys_internal_folder_t*) ASSETSYS_MALLOC( sys->memctx, 
        sizeof( *(mount->dirs) ) * mount->dirs_capacity );

    struct assetsys_internal_folder_t* dir = &mount->dirs[ mount->dirs_count++ ];
    dir->collated_index = assetsys_internal_register_collated( sys, mount_as, 0 );
    
    if( type == ASSETSYS_INTERNAL_MOUNT_TYPE_DIR )
        {
        assetsys_internal_recurse_directories( sys, dir->collated_index, mount );
        }
    else if( type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP )
        {
        memset( &mount->zip, 0, sizeof( mount->zip ) );
        mount->zip.m_pAlloc = assetsys_internal_mz_alloc;
        mount->zip.m_pRealloc = assetsys_internal_mz_realloc;
        mount->zip.m_pFree = assetsys_internal_mz_free;
        mount->zip.m_pAlloc_opaque = sys->memctx;
        //mz_bool status = mz_zip_reader_init_file( &mount->zip, path, 0 );
        mz_bool status = mz_zip_reader_init_mem( &mount->zip, zip_mem, zip_mem_size, 0 );
        if( !status )
            {
            ASSETSYS_FREE( sys->memctx, mount->dirs );
            ASSETSYS_FREE( sys->memctx, mount->files );
            return ASSETSYS_ERROR_FAILED_TO_READ_ZIP;
            }

        int count = (int) mz_zip_reader_get_num_files( &mount->zip );

        for( int i = 0; i < count; ++i )
            {
            if( mz_zip_reader_is_file_a_directory( &mount->zip, (mz_uint) i ) )
                {
                if( mount->dirs_count >= mount->dirs_capacity )
                    {
                    mount->dirs_capacity *= 2;
                    struct assetsys_internal_folder_t* new_dirs = (struct assetsys_internal_folder_t*) ASSETSYS_MALLOC( 
                        sys->memctx, sizeof( *(mount->dirs) ) * mount->dirs_capacity );
                    memcpy( new_dirs, mount->dirs, sizeof( *(mount->dirs) ) * mount->dirs_count );
                    ASSETSYS_FREE( sys->memctx, mount->dirs );
                    mount->dirs = new_dirs;
                    }

                char filename[ 1024 ];                
                mz_zip_reader_get_filename( &mount->zip, (mz_uint) i, filename, sizeof( filename ) );

                struct assetsys_internal_folder_t* as_dir = &mount->dirs[ mount->dirs_count++ ];
                strcpy( sys->temp, assetsys_internal_get_string( sys, mount->mounted_as ) );
                strcat( sys->temp, "/" );
                strcat( sys->temp, filename );
                sys->temp[ strlen( sys->temp )  - 1 ] = '\0';
                as_dir->collated_index = assetsys_internal_register_collated( sys, sys->temp, 0 );
                }
            }

        for( int i = 0; i < count; ++i )
            {
            if( !mz_zip_reader_is_file_a_directory( &mount->zip, (mz_uint) i ) )
                {
                if( mount->files_count >= mount->files_capacity )
                    {
                    mount->files_capacity *= 2;
                    struct assetsys_internal_file_t* new_files = (struct assetsys_internal_file_t*) ASSETSYS_MALLOC( 
                        sys->memctx, sizeof( *(mount->files) ) * mount->files_capacity );
                    memcpy( new_files, mount->files, sizeof( *(mount->files) ) * mount->files_count );
                    ASSETSYS_FREE( sys->memctx, mount->files );
                    mount->files = new_files;
                    }

                mz_zip_archive_file_stat stat;
                mz_bool result = mz_zip_reader_file_stat( &mount->zip, (mz_uint) i, &stat);
                if( !result )
                    {
                    mz_zip_reader_end( &mount->zip );
                    ASSETSYS_FREE( sys->memctx, mount->dirs );
                    ASSETSYS_FREE( sys->memctx, mount->files );
                    return ASSETSYS_ERROR_FAILED_TO_READ_ZIP;
                    }

                struct assetsys_internal_file_t* file = &mount->files[ mount->files_count++ ];
                strcpy( sys->temp, assetsys_internal_get_string( sys, mount->mounted_as ) );
                strcat( sys->temp, "/" );
                strcat( sys->temp, stat.m_filename );
                file->collated_index = assetsys_internal_register_collated( sys, sys->temp, 1 );
                file->size = (int) stat.m_uncomp_size;
                file->zip_index = i;

                char* dir_path = assetsys_internal_dirname( sys->temp );
                ASSETSYS_U64 handle = strpool_inject( &sys->strpool, dir_path, (int) strlen( dir_path ) - 1 );               
                int found = 0;
                for( int j = 0; j < mount->dirs_count; ++j )
                    {
                    if( handle == sys->collated[ mount->dirs[ j ].collated_index ].path )
                        found = 1;
                    }
                if( !found ) 
                    {
                    struct assetsys_internal_folder_t* as_dir = &mount->dirs[ mount->dirs_count++ ];
                    as_dir->collated_index = assetsys_internal_register_collated( sys, 
                        assetsys_internal_get_string( sys, handle ), 0 );
                    }
                }
            }
        }
        

    assetsys_internal_collate_directories( sys, mount );

    ++sys->mounts_count;
    return ASSETSYS_SUCCESS;
    }